

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O2

bool __thiscall Clasp::Asp::Preprocessor::preprocessEq(Preprocessor *this,uint32 maxIters)

{
  undefined1 *puVar1;
  uint *puVar2;
  pointer ppPVar3;
  size_type sVar4;
  LogicProgram *pLVar5;
  pointer ppPVar6;
  SharedContext *this_00;
  bool bVar7;
  ValueRep VVar8;
  pointer ppPVar9;
  pointer ppPVar10;
  VarVec *supported;
  uint32 uVar11;
  pointer ppPVar12;
  long lVar13;
  BodyExtra local_44;
  HeadRange atoms;
  
  pLVar5 = this->prg_;
  sVar4 = (((pLVar5->super_ProgramBuilder).ctx_)->varInfo_).ebo_.size;
  this->pass_ = 0;
  this->maxPass_ = maxIters;
  ppPVar6 = (pLVar5->atoms_).ebo_.buf;
  ppPVar3 = ppPVar6 + (pLVar5->input_).lo;
  ppPVar6 = ppPVar6 + (pLVar5->atoms_).ebo_.size;
  local_44 = (BodyExtra)0x0;
  atoms.first = (PrgHead **)ppPVar3;
  atoms.second = (PrgHead **)ppPVar6;
  bk_lib::
  pod_vector<Clasp::Asp::Preprocessor::BodyExtra,_std::allocator<Clasp::Asp::Preprocessor::BodyExtra>_>
  ::resize(&this->bodyInfo_,(pLVar5->bodies_).ebo_.size + 1,&local_44);
  uVar11 = this->pass_;
  while( true ) {
    this->pass_ = uVar11 + 1;
    if (1 < uVar11 + 1) {
      ppPVar9 = (this->prg_->atoms_).ebo_.buf;
      while (ppPVar9 != ppPVar6) {
        for (; ppPVar9 != ppPVar3; ppPVar9 = ppPVar9 + 1) {
          puVar1 = &((*ppPVar9)->super_PrgHead).field_0x18;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xf7ffffff;
        }
        for (; ppPVar9 != ppPVar6; ppPVar9 = ppPVar9 + 1) {
          ((*ppPVar9)->super_PrgHead).super_PrgNode =
               (PrgNode)(((ulong)((*ppPVar9)->super_PrgHead).super_PrgNode & 0xffffffff80000000) + 1
                        );
          puVar1 = &((*ppPVar9)->super_PrgHead).field_0x18;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xf7ffffff;
        }
      }
      ppPVar10 = (pointer)(ulong)(this->prg_->disjunctions_).ebo_.size;
      ppPVar12 = ppPVar10;
      if (ppPVar10 != (pointer)0x0) {
        ppPVar12 = (this->prg_->disjunctions_).ebo_.buf;
      }
      for (lVar13 = 0; (long)ppPVar10 << 3 != lVar13; lVar13 = lVar13 + 8) {
        **(ulong **)((long)ppPVar12 + lVar13) =
             (**(ulong **)((long)ppPVar12 + lVar13) & 0xffffffff80000000) + 1;
        puVar2 = (uint *)(*(long *)((long)ppPVar12 + lVar13) + 0x18);
        *puVar2 = *puVar2 & 0xf7ffffff;
      }
      this_00 = (this->prg_->super_ProgramBuilder).ctx_;
      SharedContext::popVars(this_00,(this_00->varInfo_).ebo_.size - sVar4);
      (this->litToNode_).ebo_.size = 0;
    }
    supported = LogicProgram::getSupportedBodies(this->prg_,true);
    bVar7 = classifyProgram(this,supported);
    if (!bVar7) break;
    VVar8 = simplifyClassifiedProgram(this,&atoms,this->pass_ != this->maxPass_,supported);
    if ((VVar8 != '\0') || (uVar11 = this->pass_, uVar11 == this->maxPass_)) {
      return VVar8 != '\x02';
    }
  }
  return false;
}

Assistant:

bool Preprocessor::preprocessEq(uint32 maxIters) {
	uint32 startVar = prg_->ctx()->numVars();
	ValueRep res    = value_true;
	pass_           = 0;
	maxPass_        = maxIters;
	HeadRange atoms = HeadRange(prg_->atom_begin() + prg_->startAtom(), prg_->atom_end());
	bodyInfo_.resize( prg_->numBodies() + 1 );
	do {
		if (++pass_ > 1) {
			for (HeadIter it = prg_->atom_begin(), end = atoms.second; it != end; ) {
				while (it != atoms.first){ (*it)->setInUpper(false); ++it; }
				while (it != end)        { (*it)->clearLiteral(false); (*it)->setInUpper(false); ++it; }
			}
			for (HeadIter it = prg_->disj_begin(), end = prg_->disj_end(); it != end; ++it) {
				(*it)->clearLiteral(false);
				(*it)->setInUpper(false);
			}
			prg_->ctx()->popVars(prg_->ctx()->numVars() - startVar);
			litToNode_.clear();
		}
		VarVec& supported = prg_->getSupportedBodies(true);
		if (!classifyProgram(supported)) { return false; }
		res = simplifyClassifiedProgram(atoms, pass_ != maxPass_, supported);
	} while (res == value_free && pass_ != maxPass_);
	return res != value_false;
}